

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffuptf(fitsfile *fptr,int *status)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  char *tmp;
  char message [81];
  char local_228 [8];
  char card [81];
  char local_1c8 [8];
  char lenval [40];
  char local_198 [8];
  char newform [71];
  char local_148;
  char local_147;
  char tform [71];
  char local_f8 [8];
  char keyname [75];
  char comment [73];
  LONGLONG jj;
  LONGLONG naxis2;
  LONGLONG maxlen;
  LONGLONG addr;
  LONGLONG length;
  long tflds;
  int lenform;
  int ii;
  int *status_local;
  fitsfile *fptr_local;
  
  tflds._0_4_ = 0;
  _lenform = status;
  status_local = &fptr->HDUposition;
  ffmaky(fptr,2,status);
  ffgkyjj((fitsfile *)status_local,"NAXIS2",&jj,keyname + 0x48,_lenform);
  ffgkyj((fitsfile *)status_local,"TFIELDS",&length,keyname + 0x48,_lenform);
  tflds._4_4_ = 1;
  while( true ) {
    if (length < tflds._4_4_) {
      return *_lenform;
    }
    ffkeyn("TFORM",tflds._4_4_,local_f8,_lenform);
    iVar1 = ffgkys((fitsfile *)status_local,local_f8,&local_148,keyname + 0x48,_lenform);
    if (0 < iVar1) break;
    if ((((local_148 == 'P') || (local_147 == 'P')) || (local_148 == 'Q')) || (local_147 == 'Q')) {
      naxis2 = 0;
      for (stack0xffffffffffffffa8 = 1; stack0xffffffffffffffa8 <= jj;
          register0x00000000 = stack0xffffffffffffffa8 + 1) {
        ffgdesll((fitsfile *)status_local,tflds._4_4_,stack0xffffffffffffffa8,&addr,&maxlen,_lenform
                );
        if (naxis2 < addr) {
          naxis2 = addr;
        }
      }
      strcpy(local_198,"\'");
      pcVar2 = strchr(&local_148,0x28);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      sVar3 = strlen(&local_148);
      tflds._0_4_ = (int)sVar3;
      snprintf(local_1c8,0x28,"(%.0f)",(double)naxis2);
      lVar4 = (long)(int)tflds;
      sVar3 = strlen(local_1c8);
      if (0x46 < lVar4 + sVar3 + 2) {
        ffpmsg("Error assembling TFORMn string (ffuptf).");
        *_lenform = 0x105;
        return 0x105;
      }
      strcat(local_198,&local_148);
      strcat(local_198,local_1c8);
      while (sVar3 = strlen(local_198), sVar3 < 9) {
        strcat(local_198," ");
      }
      strcat(local_198,"\'");
      ffmkky(local_f8,local_198,keyname + 0x48,local_228,_lenform);
      ffmkey((fitsfile *)status_local,local_228,_lenform);
    }
    tflds._4_4_ = tflds._4_4_ + 1;
  }
  snprintf((char *)&tmp,0x51,"Error while updating variable length vector TFORMn values (ffuptf).");
  ffpmsg((char *)&tmp);
  return *_lenform;
}

Assistant:

int ffuptf(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  Update the value of the TFORM keywords for the variable length array
  columns to make sure they all have the form 1Px(len) or Px(len) where
  'len' is the maximum length of the vector in the table (e.g., '1PE(400)')
*/
{
    int ii, lenform=0;
    long tflds;
    LONGLONG length, addr, maxlen, naxis2, jj;
    char comment[FLEN_COMMENT], keyname[FLEN_KEYWORD];
    char tform[FLEN_VALUE], newform[FLEN_VALUE], lenval[40];
    char card[FLEN_CARD];
    char message[FLEN_ERRMSG];
    char *tmp;

    ffmaky(fptr, 2, status);         /* reset to beginning of header */
    ffgkyjj(fptr, "NAXIS2", &naxis2, comment, status);
    ffgkyj(fptr, "TFIELDS", &tflds, comment, status);

    for (ii = 1; ii <= tflds; ii++)        /* loop over all the columns */
    {
      ffkeyn("TFORM", ii, keyname, status);          /* construct name */
      if (ffgkys(fptr, keyname, tform, comment, status) > 0)
      {
        snprintf(message,FLEN_ERRMSG,
        "Error while updating variable length vector TFORMn values (ffuptf).");
        ffpmsg(message);
        return(*status);
      }
      /* is this a variable array length column ? */
      if (tform[0] == 'P' || tform[1] == 'P' || tform[0] == 'Q' || tform[1] == 'Q')
      {
          /* get the max length */
          maxlen = 0;
          for (jj=1; jj <= naxis2; jj++)
          {
            ffgdesll(fptr, ii, jj, &length, &addr, status);

	    if (length > maxlen)
	         maxlen = length;
          }

          /* construct the new keyword value */
          strcpy(newform, "'");
          tmp = strchr(tform, '(');  /* truncate old length, if present */
          if (tmp) *tmp = 0;
          lenform = strlen(tform);

          /* print as double, because the string-to-64-bit */
          /* conversion is platform dependent (%lld, %ld, %I64d) */

          snprintf(lenval,40, "(%.0f)", (double) maxlen);
          
          if (lenform+strlen(lenval)+2 > FLEN_VALUE-1)
          {
             ffpmsg("Error assembling TFORMn string (ffuptf).");
             return(*status = BAD_TFORM);
          }
          strcat(newform, tform);

          strcat(newform,lenval);
          while(strlen(newform) < 9)
             strcat(newform," ");   /* append spaces 'till length = 8 */
          strcat(newform,"'" );     /* append closing parenthesis */
          /* would be simpler to just call ffmkyj here, but this */
          /* would force linking in all the modkey & putkey routines */
          ffmkky(keyname, newform, comment, card, status);  /* make new card */
          ffmkey(fptr, card, status);   /* replace last read keyword */
      }
    }
    return(*status);
}